

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool google::protobuf::internal::cpp::IsGroupLike(FieldDescriptor *field)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar2;
  Descriptor *pDVar3;
  Descriptor *pDVar4;
  string_view in_stack_ffffffffffffffb8;
  
  if (field->type_ != '\n') {
    return false;
  }
  __lhs = field->all_names_;
  FieldDescriptor::message_type(field);
  absl::lts_20240722::AsciiStrToLower_abi_cxx11_(in_stack_ffffffffffffffb8);
  bVar2 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  if ((!bVar2) && (pDVar3 = FieldDescriptor::message_type(field), pDVar3->file_ == field->file_)) {
    bVar1 = field->field_0x1;
    pDVar3 = FieldDescriptor::message_type(field);
    pDVar3 = pDVar3->containing_type_;
    if ((bVar1 & 8) == 0) {
      pDVar4 = field->containing_type_;
    }
    else {
      pDVar4 = FieldDescriptor::extension_scope(field);
    }
    return pDVar3 == pDVar4;
  }
  return false;
}

Assistant:

bool IsGroupLike(const FieldDescriptor& field) {
  // Groups are always tag-delimited, currently specified by a TYPE_GROUP type.
  if (field.type() != FieldDescriptor::TYPE_GROUP) return false;
  // Group fields always are always the lowercase type name.
  if (field.name() != absl::AsciiStrToLower(field.message_type()->name())) {
    return false;
  }

  if (field.message_type()->file() != field.file()) return false;

  // Group messages are always defined in the same scope as the field.  File
  // level extensions will compare NULL == NULL here, which is why the file
  // comparison above is necessary to ensure both come from the same file.
  return field.is_extension() ? field.message_type()->containing_type() ==
                                    field.extension_scope()
                              : field.message_type()->containing_type() ==
                                    field.containing_type();
}